

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(char lhs,SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  undefined1 in_AL;
  bool bVar1;
  undefined7 in_register_00000001;
  undefined1 in_SIL;
  undefined1 in_DIL;
  char ret;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  undefined5 unaff_retaddr;
  undefined1 unaff_retaddr_00;
  char *in_stack_00000008;
  char *in_stack_00000010;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar4;
  undefined8 uVar2;
  undefined8 uVar3;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *result_00;
  
  uVar2 = CONCAT26(CONCAT11((char)((uint7)in_register_00000001 >> 0x30),in_SIL),
                   CONCAT15(in_DIL,(int5)CONCAT71(in_register_00000001,in_AL)));
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             &stack0xfffffffffffffffc);
  SVar4.m_int = (char)((ulong)uVar2 >> 0x30);
  uVar3 = CONCAT44((int)((ulong)uVar2 >> 0x20),CONCAT13(SVar4.m_int,(int3)uVar2));
  bVar1 = DivisionCornerCaseHelper<signed_char,_signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
          ::DivisionCornerCase1
                    ((char)((ulong)uVar2 >> 0x28),SVar4,
                     (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                     &stack0xfffffffffffffffc);
  if (bVar1) {
    SVar4.m_int = (char)((ulong)uVar3 >> 0x20);
  }
  else {
    result_00 = (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                CONCAT53((int5)((ulong)uVar3 >> 0x18),
                         CONCAT12((char)((ulong)uVar3 >> 0x30),(short)uVar3));
    bVar1 = DivisionCornerCaseHelper2<signed_char,_signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
            ::DivisionCornerCase2(lhs,rhs,result_00);
    if (bVar1) {
      SVar4.m_int = (char)((ulong)result_00 >> 0x20);
    }
    else {
      SVar4.m_int = (char)((ulong)result_00 >> 0x38);
      SafeInt::operator_cast_to_signed_char
                ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 CONCAT17(unaff_retaddr_00,CONCAT16(rhs.m_int,CONCAT15(lhs,unaff_retaddr))));
      DivisionHelper<signed_char,_signed_char,_5>::
      DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
                (in_stack_00000010,in_stack_00000008,
                 (char *)CONCAT17(unaff_retaddr_00,CONCAT16(rhs.m_int,CONCAT15(lhs,unaff_retaddr))))
      ;
      SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
                ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &stack0xffffffffffffffff,&stack0xfffffffffffffff9);
    }
  }
  return (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)SVar4.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}